

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

UBool __thiscall
icu_63::CopyHelper::copyRangeCE32(CopyHelper *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  uint32_t value;
  
  value = copyCE32(this,ce32);
  utrie2_setRange32_63(this->dest->trie,start,end,value,'\x01',&this->errorCode);
  if ((value & 0xcf) == 199) {
    UnicodeSet::add(&this->dest->contextChars,start,end);
  }
  return this->errorCode < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

UBool copyRangeCE32(UChar32 start, UChar32 end, uint32_t ce32) {
        ce32 = copyCE32(ce32);
        utrie2_setRange32(dest.trie, start, end, ce32, TRUE, &errorCode);
        if(CollationDataBuilder::isBuilderContextCE32(ce32)) {
            dest.contextChars.add(start, end);
        }
        return U_SUCCESS(errorCode);
    }